

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O3

void TemplateCacheUnittest::TestFreeze(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  _Alloc_hider _Var7;
  int iVar8;
  Template *tpl;
  long lVar9;
  Template *tpl_00;
  string *this;
  bool bVar10;
  string pathA;
  string incname;
  string filename3;
  string pathB;
  string filename2;
  string filename1;
  TemplateCache cache;
  TemplateDictionary dict;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  undefined1 local_140 [32];
  TemplateString local_120 [2];
  char *local_e0;
  undefined8 uStack_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined8 uStack_c8;
  char *local_c0;
  size_t sStack_b8;
  undefined1 local_b0;
  uint7 uStack_af;
  undefined8 uStack_a8;
  TemplateDictionary local_a0 [112];
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_120);
  local_140._0_8_ = "dict";
  local_140._8_8_ = 4;
  local_140[0x10] = true;
  local_140._24_8_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_a0,(TemplateString *)local_140,(UnsafeArena *)0x0);
  paVar2 = &local_160.field_2;
  local_160._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"{valid template}","");
  ctemplate::StringToTemplateFile((string *)local_140,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  paVar1 = &local_200.field_2;
  local_200._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"hi {{>INC:h}} bar\n","");
  ctemplate::StringToTemplateFile(&local_160,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  local_200._M_dataplus._M_p = (pointer)local_140._0_8_;
  local_200._M_string_length = local_140._8_8_;
  local_200.field_2._M_local_buf[0] = '\0';
  local_200.field_2._8_8_ = 0;
  tpl = (Template *)ctemplate::TemplateCache::GetTemplate(local_120,(Strip)&local_200);
  if (tpl == (Template *)0x0) {
    __assert_fail("cache_tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3d7,"static void TemplateCacheUnittest::TestFreeze()");
  }
  local_200._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"{valid template}","");
  ctemplate::AssertExpandIs(tpl,local_a0,&local_200,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  local_200._M_dataplus._M_p = local_160._M_dataplus._M_p;
  local_200._M_string_length = local_160._M_string_length;
  local_200.field_2._M_local_buf[0] = '\0';
  local_200.field_2._8_8_ = 0;
  lVar9 = ctemplate::TemplateCache::GetTemplate(local_120,(Strip)&local_200);
  if (lVar9 == 0) {
    __assert_fail("cache_tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3da,"static void TemplateCacheUnittest::TestFreeze()");
  }
  local_200._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"hi  bar\n","");
  ctemplate::AssertExpandWithCacheIs
            ((TemplateCache *)local_120,&local_160,DO_NOT_STRIP,local_a0,(PerExpandData *)0x0,
             &local_200,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"a/","");
  ctemplate::PathJoin((string *)&local_200,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  ctemplate::CreateOrCleanTestDir(&local_200);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)local_120);
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  _Var7._M_p = local_1c0._M_dataplus._M_p;
  if (local_1c0._M_string_length == local_200._M_string_length) {
    if (local_1c0._M_string_length == 0) {
      bVar10 = true;
    }
    else {
      iVar8 = bcmp(local_1c0._M_dataplus._M_p,local_200._M_dataplus._M_p,local_1c0._M_string_length)
      ;
      bVar10 = iVar8 == 0;
    }
  }
  else {
    bVar10 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_1c0.field_2) {
    operator_delete(_Var7._M_p);
  }
  if (bVar10) {
    ctemplate::TemplateCache::Freeze();
    paVar1 = &local_1e0.field_2;
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"{yet another valid template}","");
    ctemplate::StringToTemplateFile(&local_1c0,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    local_1e0._M_dataplus._M_p = local_1c0._M_dataplus._M_p;
    local_1e0._M_string_length = local_1c0._M_string_length;
    local_1e0.field_2._M_local_buf[0] = '\0';
    local_1e0.field_2._8_8_ = 0;
    lVar9 = ctemplate::TemplateCache::GetTemplate(local_120,(Strip)&local_1e0);
    if (lVar9 != 0) {
      __assert_fail("!cache_tpl3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3eb,"static void TemplateCacheUnittest::TestFreeze()");
    }
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"{file1 contents changed}","");
    ctemplate::StringToFile(&local_1e0,(string *)local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)local_120);
    local_1e0._M_dataplus._M_p = (pointer)local_140._0_8_;
    local_1e0._M_string_length = local_140._8_8_;
    local_1e0.field_2._M_local_buf[0] = '\0';
    local_1e0.field_2._8_8_ = 0;
    tpl_00 = (Template *)ctemplate::TemplateCache::GetTemplate(local_120,(Strip)&local_1e0);
    if (tpl_00 != tpl) {
      printf("ASSERT FAILED, line %d: %s\n",0x3f3,"cache_tpl1_post_reload == cache_tpl1");
      __assert_fail("cache_tpl1_post_reload == cache_tpl1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3f3,"static void TemplateCacheUnittest::TestFreeze()");
    }
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"{valid template}","");
    ctemplate::AssertExpandIs(tpl_00,local_a0,&local_1e0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    local_1e0._M_dataplus._M_p = (pointer)local_140._0_8_;
    local_1e0._M_string_length = local_140._8_8_;
    local_1e0.field_2._M_local_buf[0] = '\0';
    local_1e0.field_2._8_8_ = 0;
    ctemplate::TemplateCache::Delete(local_120);
    local_1e0._M_dataplus._M_p = (pointer)local_140._0_8_;
    local_1e0._M_string_length = local_140._8_8_;
    local_1e0.field_2._M_local_buf[0] = '\0';
    local_1e0.field_2._8_8_ = 0;
    lVar9 = ctemplate::TemplateCache::GetTemplate(local_120,(Strip)&local_1e0);
    if (lVar9 == 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x3f9,"cache.GetTemplate(filename1, STRIP_WHITESPACE)");
      local_1e0._M_dataplus._M_p = (pointer)local_140._0_8_;
      local_1e0._M_string_length = local_140._8_8_;
      local_1e0.field_2._M_local_buf[0] = '\0';
      local_1e0.field_2._8_8_ = 0;
      lVar9 = ctemplate::TemplateCache::GetTemplate(local_120,(Strip)&local_1e0);
      if (lVar9 == 0) {
        __assert_fail("cache.GetTemplate(filename1, STRIP_WHITESPACE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x3f9,"static void TemplateCacheUnittest::TestFreeze()");
      }
      goto LAB_0011205b;
    }
    paVar3 = &local_1a0.field_2;
    local_1a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a0,"include & print file\n","");
    ctemplate::StringToTemplateFile(&local_1e0,&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    local_e0 = "INC";
    uStack_d8 = 3;
    local_d0 = 1;
    uStack_c8 = 0;
    TVar5._17_7_ = uStack_cf;
    TVar5.is_immutable_ = true;
    TVar5.length_ = 3;
    TVar5.ptr_ = "INC";
    TVar5.id_ = 0;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar5);
    local_c0 = local_1e0._M_dataplus._M_p;
    sStack_b8 = local_1e0._M_string_length;
    local_b0 = 0;
    uStack_a8 = 0;
    TVar6.length_ = local_1e0._M_string_length;
    TVar6.ptr_ = local_1e0._M_dataplus._M_p;
    TVar6._16_8_ = (ulong)uStack_af << 8;
    TVar6.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar6);
    local_1a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"hi  bar\n","");
    ctemplate::AssertExpandWithCacheIs
              ((TemplateCache *)local_120,&local_160,DO_NOT_STRIP,local_a0,(PerExpandData *)0x0,
               &local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    paVar4 = &local_180.field_2;
    local_180._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"b/","");
    ctemplate::PathJoin((string *)&local_1a0,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar4) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    ctemplate::CreateOrCleanTestDir(&local_1a0);
    ctemplate::TemplateCache::SetTemplateRootDirectory((string *)local_120);
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    _Var7._M_p = local_180._M_dataplus._M_p;
    if (local_180._M_string_length == local_200._M_string_length) {
      if (local_180._M_string_length == 0) {
        bVar10 = true;
      }
      else {
        iVar8 = bcmp(local_180._M_dataplus._M_p,local_200._M_dataplus._M_p,
                     local_180._M_string_length);
        bVar10 = iVar8 == 0;
      }
    }
    else {
      bVar10 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p != paVar4) {
      operator_delete(_Var7._M_p);
    }
    if (bVar10) {
      ctemplate::CreateOrCleanTestDir(&local_200);
      ctemplate::CreateOrCleanTestDir(&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != paVar2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
        operator_delete((void *)local_140._0_8_);
      }
      ctemplate::TemplateDictionary::~TemplateDictionary(local_a0);
      ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_120);
      return;
    }
    printf("ASSERT FAILED, line %d: %s\n",0x405,"cache.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    if (local_180._M_string_length != local_200._M_string_length) {
LAB_00112084:
      __assert_fail("cache.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x405,"static void TemplateCacheUnittest::TestFreeze()");
    }
    if (local_180._M_string_length != 0) {
      iVar8 = bcmp(local_180._M_dataplus._M_p,local_200._M_dataplus._M_p,local_180._M_string_length)
      ;
      if (iVar8 != 0) goto LAB_00112084;
    }
    this = &local_180;
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0x3e3,"cache.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    if (local_1c0._M_string_length != local_200._M_string_length) {
LAB_00112065:
      __assert_fail("cache.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3e3,"static void TemplateCacheUnittest::TestFreeze()");
    }
    if (local_1c0._M_string_length != 0) {
      iVar8 = bcmp(local_1c0._M_dataplus._M_p,local_200._M_dataplus._M_p,local_1c0._M_string_length)
      ;
      if (iVar8 != 0) goto LAB_00112065;
    }
    this = &local_1c0;
  }
  std::__cxx11::string::~string((string *)this);
LAB_0011205b:
  exit(1);
}

Assistant:

static void TestFreeze() {
    TemplateCache cache;
     TemplateDictionary dict("dict");

    // Load some templates
    string filename1 = StringToTemplateFile("{valid template}");
    string filename2 = StringToTemplateFile("hi {{>INC:h}} bar\n");

    const Template* cache_tpl1 = cache.GetTemplate(filename1, STRIP_WHITESPACE);
    assert(cache_tpl1);
    AssertExpandIs(cache_tpl1, &dict, "{valid template}", true);
    const Template* cache_tpl2 = cache.GetTemplate(filename2, DO_NOT_STRIP);
    assert(cache_tpl2);
    static_cast<void>(cache_tpl2);  // avoid unused var warning in opt mode
    AssertExpandWithCacheIs(&cache, filename2, DO_NOT_STRIP, &dict, NULL,
                            "hi  bar\n", true);

    // Set the root directory
    const string pathA = PathJoin(FLAGS_test_tmpdir, "a/");
    CreateOrCleanTestDir(pathA);
    cache.SetTemplateRootDirectory(pathA);
    ASSERT(cache.template_root_directory() == pathA);

    // Freeze the cache now, and test its impact.
    cache.Freeze();

    // 1. Loading new templates fails.
    string filename3 = StringToTemplateFile("{yet another valid template}");
    const Template* cache_tpl3 = cache.GetTemplate(filename3, STRIP_WHITESPACE);
    assert(!cache_tpl3);
    static_cast<void>(cache_tpl3);  // avoid unused var warning in opt mode

    // 2. Reloading existing templates fails.
    StringToFile("{file1 contents changed}", filename1);
    cache.ReloadAllIfChanged(TemplateCache::LAZY_RELOAD);
    const Template* cache_tpl1_post_reload = cache.GetTemplate(
        filename1, STRIP_WHITESPACE);
    ASSERT(cache_tpl1_post_reload == cache_tpl1);
    // Check that cache's tpl1 has the same old contents
    AssertExpandIs(cache_tpl1_post_reload, &dict, "{valid template}",
                   true);
    // 3. Cannot delete from a frozen cache.
    cache.Delete(filename1);
    ASSERT(cache.GetTemplate(filename1, STRIP_WHITESPACE));

    // 4. Expand won't load an included template on-demand.
    string incname = StringToTemplateFile("include & print file\n");
    dict.AddIncludeDictionary("INC")->SetFilename(incname);
    AssertExpandWithCacheIs(&cache, filename2, DO_NOT_STRIP, &dict, NULL,
                            "hi  bar\n", false);

    // 5. Cannot change template root directory.
    const string pathB = PathJoin(FLAGS_test_tmpdir, "b/");
    CreateOrCleanTestDir(pathB);
    cache.SetTemplateRootDirectory(pathB);
    ASSERT(cache.template_root_directory() == pathA);  // Still the old path

    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);
  }